

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_compile_node_deviations_refines
                 (lysc_ctx *ctx,lysp_node *pnode,lysc_node *parent,lysp_node **dev_pnode,
                 ly_bool *not_supported)

{
  lysp_ext_instance **pplVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  lyd_node *plVar5;
  lyd_node *plVar6;
  undefined8 *puVar7;
  lysp_module *plVar8;
  lysp_restr *plVar9;
  lys_module *plVar10;
  lysp_module *plVar11;
  ly_bool lVar12;
  ushort uVar13;
  LY_ERR LVar14;
  ly_stmt lVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  long *plVar19;
  lysp_restr **pplVar20;
  lysp_ext_instance *plVar21;
  lysp_node *plVar22;
  lysp_node *plVar23;
  lysc_node *plVar24;
  void *pvVar25;
  char *pcVar26;
  long lVar27;
  long lVar28;
  lysp_node **pplVar29;
  LY_VECODE LVar30;
  void *pvVar31;
  size_t sVar32;
  lysp_node *plVar33;
  undefined8 *puVar34;
  lysp_qname *plVar35;
  uint16_t uVar36;
  ly_ctx *plVar37;
  char *pcVar38;
  lysp_node *plVar39;
  char *__s2;
  char *pcVar40;
  undefined8 uVar41;
  ulong uVar42;
  lysp_ext_instance *plVar43;
  ulong uVar44;
  char *pcVar45;
  char local_1028 [4088];
  
  *dev_pnode = (lysp_node *)0x0;
  *not_supported = '\0';
  if ((ctx->uses_rfns).count != 0) {
    uVar42 = 0;
    do {
      while( true ) {
        plVar5 = (ctx->uses_rfns).field_2.dnodes[uVar42];
        plVar24 = (lysc_node *)plVar5->parent;
        lVar12 = lysp_schema_nodeid_match
                           (*(lysc_nodeid **)plVar5,(lysp_module *)plVar5->schema,
                            (lysp_ext_instance *)0x0,plVar24,parent,pnode,ctx->cur_mod,ctx->ext);
        if (lVar12 == '\0') break;
        if ((*dev_pnode == (lysp_node *)0x0) &&
           (LVar14 = lysp_dup_single(ctx,pnode,(ly_bool)dev_pnode,(lysp_node **)plVar24),
           LVar14 != LY_SUCCESS)) goto LAB_0014f669;
        pvVar31 = (void *)0x0;
        while( true ) {
          plVar6 = plVar5->prev;
          if (plVar6 == (lyd_node *)0x0) {
            pvVar25 = (void *)0x0;
          }
          else {
            pvVar25 = plVar6[-1].priv;
          }
          if (pvVar25 <= pvVar31) break;
          puVar7 = *(undefined8 **)(&plVar6->hash + (long)pvVar31 * 2);
          plVar8 = (lysp_module *)plVar5->schema;
          plVar23 = *dev_pnode;
          plVar10 = ctx->cur_mod;
          plVar11 = ctx->pmod;
          ctx->cur_mod = plVar8->mod;
          ctx->pmod = plVar8;
          lysc_update_path(ctx,(lys_module *)0x0,"{refine}");
          lysc_update_path(ctx,(lys_module *)0x0,(char *)*puVar7);
          lVar28 = puVar7[6];
          if (lVar28 == 0) {
LAB_0014d89c:
            if (puVar7[1] == 0) {
LAB_0014d8cc:
              if (puVar7[2] != 0) {
                lydict_remove(ctx->ctx,plVar23->ref);
                LVar14 = lydict_dup(ctx->ctx,(char *)puVar7[2],&plVar23->ref);
                if (LVar14 != LY_SUCCESS) goto LAB_0014df4e;
              }
              uVar13 = *(ushort *)(puVar7 + 9);
              if ((uVar13 & 3) != 0) {
                uVar4 = ctx->compile_opts;
                if ((uVar4 & 4) == 0) {
                  plVar23->flags = uVar13 & 3 | plVar23->flags & 0xfffc;
                }
                else {
                  pcVar17 = "notification";
                  if ((uVar4 >> 0xe & 1) == 0) {
                    pcVar17 = "a subtree ignoring config";
                  }
                  if ((uVar4 & 0x3000) != 0) {
                    pcVar17 = "RPC/action";
                  }
                  ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,
                         "Refining config inside %s has no effect (%s).",pcVar17,ctx->path);
                  uVar13 = *(ushort *)(puVar7 + 9);
                }
              }
              if ((uVar13 & 0x60) != 0) {
                uVar3 = plVar23->nodetype;
                if (((0x20 < (ulong)uVar3) || ((0x100000014U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
                   (uVar3 != 0x60)) {
                  plVar37 = ctx->ctx;
                  pcVar17 = lys_nodetype2str(uVar3);
                  pcVar45 = "mandatory";
                  goto LAB_0014df35;
                }
                plVar23->flags = uVar13 & 0x60 | plVar23->flags & 0xff9f;
              }
              if (puVar7[5] != 0) {
                plVar37 = ctx->ctx;
                if (plVar23->nodetype != 1) {
                  pcVar17 = lys_nodetype2str(plVar23->nodetype);
                  pcVar45 = "presence";
                  goto LAB_0014df35;
                }
                lydict_remove(plVar37,(char *)plVar23[1].next);
                LVar14 = lydict_dup(ctx->ctx,(char *)puVar7[5],(char **)&plVar23[1].next);
                if (LVar14 != LY_SUCCESS) goto LAB_0014df4e;
              }
              if (puVar7[4] == 0) {
LAB_0014db59:
                uVar4 = *(uint *)(puVar7 + 9);
                if ((uVar4 >> 9 & 1) != 0) {
                  uVar36 = plVar23->nodetype;
                  if (uVar36 == 8) {
                    lVar28 = 200;
                  }
                  else {
                    if (uVar36 != 0x10) {
                      plVar37 = ctx->ctx;
                      pcVar17 = lys_nodetype2str(uVar36);
                      pcVar45 = "min-elements";
                      goto LAB_0014df35;
                    }
                    lVar28 = 0x88;
                  }
                  *(undefined4 *)((long)&plVar23->parent + lVar28) = *(undefined4 *)(puVar7 + 7);
                }
                if ((uVar4 >> 10 & 1) != 0) {
                  uVar36 = plVar23->nodetype;
                  if (uVar36 == 8) {
                    lVar28 = 0xcc;
                  }
                  else {
                    if (uVar36 != 0x10) {
                      plVar37 = ctx->ctx;
                      pcVar17 = lys_nodetype2str(uVar36);
                      pcVar45 = "max-elements";
                      goto LAB_0014df35;
                    }
                    lVar28 = 0x8c;
                  }
                  *(undefined4 *)((long)&plVar23->parent + lVar28) =
                       *(undefined4 *)((long)puVar7 + 0x3c);
                }
                if (puVar7[3] == 0) {
LAB_0014de6d:
                  lVar28 = puVar7[8];
                  LVar14 = LY_SUCCESS;
                  if (lVar28 != 0) {
                    plVar43 = plVar23->exts;
                    if (plVar43 == (lysp_ext_instance *)0x0) {
                      plVar19 = (long *)calloc(1,*(long *)(lVar28 + -8) * 0x70 | 8);
                      if (plVar19 == (long *)0x0) goto LAB_0014f6ba;
                      lVar28 = 0;
                      plVar21 = (lysp_ext_instance *)0x0;
                    }
                    else {
                      plVar21 = plVar43[-1].exts;
                      plVar19 = (long *)realloc(&plVar43[-1].exts,
                                                ((long)&plVar21->name + *(long *)(lVar28 + -8)) *
                                                0x70 | 8);
                      if (plVar19 == (long *)0x0) {
LAB_0014f6ba:
                        plVar37 = ctx->ctx;
                        pcVar17 = "lys_apply_refine";
                        goto LAB_0014f6e0;
                      }
                      lVar28 = *plVar19;
                    }
                    plVar23->exts = (lysp_ext_instance *)(plVar19 + 1);
                    if (puVar7[8] == 0) {
                      sVar32 = 0;
                    }
                    else {
                      sVar32 = *(long *)(puVar7[8] + -8) * 0x70;
                    }
                    memset(plVar19 + lVar28 * 0xe + 1,0,sVar32);
                    uVar44 = 0xffffffffffffffff;
                    lVar28 = 0;
                    while( true ) {
                      if (puVar7[8] == 0) {
                        uVar18 = 0;
                      }
                      else {
                        uVar18 = *(ulong *)(puVar7[8] + -8);
                      }
                      uVar44 = uVar44 + 1;
                      LVar14 = LY_SUCCESS;
                      if (uVar18 <= uVar44) break;
                      pplVar1 = &plVar23->exts[-1].exts;
                      *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
                      plVar37 = ctx->ctx;
                      lVar15 = lyplg_ext_nodetype2stmt(plVar23->nodetype);
                      LVar14 = lysp_ext_dup(plVar37,plVar8,plVar23,lVar15,
                                            (lysp_ext_instance *)(puVar7[8] + lVar28),
                                            (lysp_ext_instance *)
                                            ((long)&plVar23->exts[(long)plVar21].name + lVar28));
                      lVar28 = lVar28 + 0x70;
                      if (LVar14 != LY_SUCCESS) goto LAB_0014f669;
                    }
                  }
                }
                else {
                  uVar13 = plVar23->nodetype;
                  if (((0x20 < (ulong)uVar13) || ((0x100010116U >> ((ulong)uVar13 & 0x3f) & 1) == 0)
                      ) && ((uVar13 != 0x60 && (uVar13 != 0x80)))) {
                    plVar37 = ctx->ctx;
                    pcVar17 = lys_nodetype2str(uVar13);
                    pcVar45 = "if-feature";
                    goto LAB_0014defa;
                  }
                  uVar44 = 0xffffffffffffffff;
                  lVar28 = 0;
                  do {
                    if (puVar7[3] == 0) {
                      uVar18 = 0;
                    }
                    else {
                      uVar18 = *(ulong *)(puVar7[3] + -8);
                    }
                    uVar44 = uVar44 + 1;
                    if (uVar18 <= uVar44) goto LAB_0014de6d;
                    plVar35 = plVar23->iffeatures;
                    if (plVar35 != (lysp_qname *)0x0) {
                      lVar27 = *(long *)&plVar35[-1].flags;
                      *(long *)&plVar35[-1].flags = lVar27 + 1;
                      plVar19 = (long *)realloc(&plVar35[-1].flags,lVar27 * 0x18 + 0x20);
                      if (plVar19 != (long *)0x0) {
                        lVar27 = *plVar19;
                        goto LAB_0014de1d;
                      }
                      plVar23 = (lysp_node *)plVar23->iffeatures;
LAB_0014e06b:
                      plVar23[-1].exts = (lysp_ext_instance *)((long)&plVar23[-1].exts[-1].exts + 7)
                      ;
LAB_0014e06f:
                      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                             "lys_apply_refine");
                      LVar14 = LY_EMEM;
                      break;
                    }
                    plVar19 = (long *)malloc(0x20);
                    if (plVar19 == (long *)0x0) goto LAB_0014e06f;
                    *plVar19 = 1;
                    lVar27 = 1;
LAB_0014de1d:
                    plVar23->iffeatures = (lysp_qname *)(plVar19 + 1);
                    plVar19 = plVar19 + lVar27 * 3;
                    ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                    plVar19[-1] = 0;
                    *plVar19 = 0;
                    LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(puVar7[3] + lVar28),
                                            (lysp_qname *)(plVar19 + -2));
                    lVar28 = lVar28 + 0x18;
                  } while (LVar14 == LY_SUCCESS);
                }
              }
              else {
                uVar13 = plVar23->nodetype;
                if (((0x20 < (ulong)uVar13) || ((0x100010112U >> ((ulong)uVar13 & 0x3f) & 1) == 0))
                   && (uVar13 != 0x60)) {
                  plVar37 = ctx->ctx;
                  pcVar17 = lys_nodetype2str(uVar13);
                  pcVar45 = "must";
LAB_0014defa:
                  LVar30 = LYVE_REFERENCE;
                  pcVar26 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                  pcVar40 = "add";
                  goto LAB_0014df3e;
                }
                uVar44 = 0xffffffffffffffff;
                lVar28 = 0;
                do {
                  if (puVar7[4] == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar18 = *(ulong *)(puVar7[4] + -8);
                  }
                  uVar44 = uVar44 + 1;
                  if (uVar18 <= uVar44) goto LAB_0014db59;
                  plVar33 = plVar23[1].parent;
                  if (plVar33 == (lysp_node *)0x0) {
                    plVar19 = (long *)malloc(0x48);
                    if (plVar19 == (long *)0x0) goto LAB_0014e06f;
                    *plVar19 = 1;
                    lVar27 = 1;
                  }
                  else {
                    plVar43 = (lysp_ext_instance *)((long)&(plVar33[-1].exts)->name + 1);
                    plVar33[-1].exts = plVar43;
                    plVar19 = (long *)realloc(&plVar33[-1].exts,(long)plVar43 * 0x40 | 8);
                    if (plVar19 == (long *)0x0) {
                      plVar23 = plVar23[1].parent;
                      goto LAB_0014e06b;
                    }
                    lVar27 = *plVar19;
                  }
                  plVar23[1].parent = (lysp_node *)(plVar19 + 1);
                  plVar19 = plVar19 + lVar27 * 8;
                  plVar19[-1] = 0;
                  *plVar19 = 0;
                  plVar19[-3] = 0;
                  plVar19[-2] = 0;
                  plVar19[-5] = 0;
                  plVar19[-4] = 0;
                  (((lysp_restr *)(plVar19 + -7))->arg).str = (char *)0x0;
                  plVar19[-6] = 0;
                  LVar14 = lysp_restr_dup(ctx->ctx,plVar8,(lysp_restr *)(puVar7[4] + lVar28),
                                          (lysp_restr *)(plVar19 + -7));
                  lVar28 = lVar28 + 0x40;
                } while (LVar14 == LY_SUCCESS);
              }
            }
            else {
              lydict_remove(ctx->ctx,plVar23->dsc);
              LVar14 = lydict_dup(ctx->ctx,(char *)puVar7[1],&plVar23->dsc);
              if (LVar14 == LY_SUCCESS) goto LAB_0014d8cc;
            }
          }
          else {
            uVar36 = plVar23->nodetype;
            if (uVar36 == 2) {
              plVar37 = ctx->ctx;
              if (*(ulong *)(lVar28 + -8) < 2) {
                plVar33 = (lysp_node *)&plVar23[1].next;
                plVar22 = plVar23[1].next;
LAB_0014d87c:
                lydict_remove(plVar37,(char *)plVar22);
                LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)puVar7[6],(lysp_qname *)plVar33);
                if (LVar14 != LY_SUCCESS) goto LAB_0014df4e;
                goto LAB_0014d89c;
              }
              uVar36 = 2;
LAB_0014d7cc:
              pcVar17 = lys_nodetype2str(uVar36);
              if (puVar7[6] == 0) {
                pcVar40 = (char *)0x0;
              }
              else {
                pcVar40 = *(char **)(puVar7[6] + -8);
              }
              LVar30 = LYVE_SEMANTICS;
              pcVar26 = "Invalid %s of %s with too many (%lu) %s properties.";
              pcVar45 = "default";
LAB_0014df3e:
              ly_vlog(plVar37,(char *)0x0,LVar30,pcVar26,"refine",pcVar17,pcVar40,pcVar45);
            }
            else {
              if (uVar36 != 8) {
                if (uVar36 == 4) {
                  plVar37 = ctx->ctx;
                  if (*(ulong *)(lVar28 + -8) < 2) {
                    plVar33 = plVar23 + 3;
                    plVar22 = plVar23[3].parent;
                    goto LAB_0014d87c;
                  }
                  uVar36 = 4;
                  goto LAB_0014d7cc;
                }
                plVar37 = ctx->ctx;
                pcVar17 = lys_nodetype2str(uVar36);
                pcVar45 = "default";
LAB_0014df35:
                LVar30 = LYVE_REFERENCE;
                pcVar26 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                pcVar40 = "replace";
                goto LAB_0014df3e;
              }
              if (1 < *(byte *)(*(long *)(lVar28 + 8) + 0x78)) {
                plVar33 = plVar23[3].parent;
                if (plVar33 != (lysp_node *)0x0) {
                  plVar43 = (lysp_ext_instance *)0xffffffffffffffff;
                  lVar28 = 0;
                  do {
                    plVar43 = (lysp_ext_instance *)((long)&plVar43->name + 1);
                    if (plVar33[-1].exts <= plVar43) {
                      free(&plVar33[-1].exts);
                      break;
                    }
                    plVar35 = (lysp_qname *)((long)&plVar33->parent + lVar28);
                    lVar28 = lVar28 + 0x18;
                    lysp_qname_free(ctx->ctx,plVar35);
                    plVar33 = plVar23[3].parent;
                  } while (plVar33 != (lysp_node *)0x0);
                }
                plVar23[3].parent = (lysp_node *)0x0;
                uVar44 = 0xffffffffffffffff;
                lVar28 = 0;
                do {
                  if (puVar7[6] == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar18 = *(ulong *)(puVar7[6] + -8);
                  }
                  uVar44 = uVar44 + 1;
                  if (uVar18 <= uVar44) goto LAB_0014d89c;
                  plVar33 = plVar23[3].parent;
                  if (plVar33 == (lysp_node *)0x0) {
                    plVar19 = (long *)malloc(0x20);
                    if (plVar19 == (long *)0x0) goto LAB_0014e06f;
                    *plVar19 = 1;
                    lVar27 = 1;
                  }
                  else {
                    plVar43 = plVar33[-1].exts;
                    plVar33[-1].exts = (lysp_ext_instance *)((long)&plVar43->name + 1);
                    plVar19 = (long *)realloc(&plVar33[-1].exts,(long)plVar43 * 0x18 + 0x20);
                    if (plVar19 == (long *)0x0) {
                      plVar23 = plVar23[3].parent;
                      goto LAB_0014e06b;
                    }
                    lVar27 = *plVar19;
                  }
                  plVar23[3].parent = (lysp_node *)(plVar19 + 1);
                  plVar35 = (lysp_qname *)(plVar19 + lVar27 * 3 + -2);
                  plVar35->str = (char *)0x0;
                  plVar35->mod = (lysp_module *)0x0;
                  *(undefined8 *)&plVar35->flags = 0;
                  LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(puVar7[6] + lVar28),plVar35);
                  lVar28 = lVar28 + 0x18;
                } while (LVar14 == LY_SUCCESS);
                goto LAB_0014df4e;
              }
              ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                      "Invalid refine of default in leaf-list - the default statement is allowed only in YANG 1.1 modules."
                     );
            }
            LVar14 = LY_EVALID;
          }
LAB_0014df4e:
          ctx->cur_mod = plVar10;
          ctx->pmod = plVar11;
          lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
          lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
          pvVar31 = (void *)((long)pvVar31 + 1);
          if (LVar14 != LY_SUCCESS) goto LAB_0014f669;
        }
        lysc_refine_free(ctx->ctx,(lysc_refine *)plVar5);
        ly_set_rm_index(&ctx->uses_rfns,(uint32_t)uVar42,(_func_void_void_ptr *)0x0);
        if ((ctx->uses_rfns).count <= uVar42) goto LAB_0014e0da;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < (ctx->uses_rfns).count);
  }
LAB_0014e0da:
  if ((ctx->devs).count != 0) {
    uVar42 = 0;
    do {
      plVar5 = (ctx->devs).field_2.dnodes[uVar42];
      pplVar29 = (lysp_node **)0x0;
      lVar12 = lysp_schema_nodeid_match
                         (*(lysc_nodeid **)plVar5,*(lysp_module **)&plVar5->parent->field_0,
                          (lysp_ext_instance *)0x0,(lysc_node *)0x0,parent,pnode,ctx->cur_mod,
                          ctx->ext);
      if (lVar12 != '\0') {
        if (*(ly_bool *)&plVar5->next != '\0') {
          *not_supported = '\x01';
          goto LAB_0014e13d;
        }
        if ((*dev_pnode == (lysp_node *)0x0) &&
           (LVar14 = lysp_dup_single(ctx,pnode,(ly_bool)dev_pnode,pplVar29), LVar14 != LY_SUCCESS))
        goto LAB_0014f669;
        pcVar17 = ctx->path;
        pvVar31 = (void *)0x0;
        goto LAB_0014e193;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < (ctx->devs).count);
  }
  return LY_SUCCESS;
LAB_0014e193:
  plVar24 = plVar5->schema;
  if (plVar24 == (lysc_node *)0x0) {
    pvVar25 = (void *)0x0;
  }
  else {
    pvVar25 = plVar24[-1].priv;
  }
  if (pvVar25 <= pvVar31) {
LAB_0014e13d:
    lysc_deviation_free(ctx->ctx,(lysc_deviation *)plVar5);
    ly_set_rm_index(&ctx->devs,(uint32_t)uVar42,(_func_void_void_ptr *)0x0);
    return LY_SUCCESS;
  }
  puVar7 = *(undefined8 **)(plVar24->hash + (long)pvVar31 * 8 + -4);
  plVar8 = *(lysp_module **)((long)&plVar5->parent->field_0 + (long)pvVar31 * 8);
  plVar23 = *dev_pnode;
  plVar10 = ctx->cur_mod;
  plVar11 = ctx->pmod;
  strcpy(local_1028,pcVar17);
  ctx->path_len = 1;
  ctx->cur_mod = plVar8->mod;
  ctx->pmod = plVar8;
  lysc_update_path(ctx,(lys_module *)0x0,"{deviation}");
  lysc_update_path(ctx,(lys_module *)0x0,(char *)*puVar7);
  pcVar40 = (char *)puVar7[3];
  if (pcVar40 != (char *)0x0) {
    pplVar29 = &plVar23[1].next;
    pplVar1 = &plVar23[2].exts;
    plVar33 = plVar23 + 3;
    do {
      cVar2 = *pcVar40;
      if (cVar2 == '\x04') {
        if (*(long *)(pcVar40 + 0x18) != 0) {
          uVar36 = plVar23->nodetype;
          if ((uVar36 == 4) || (uVar36 == 8)) {
            lysp_type_free(&ctx->free_ctx,(lysp_type *)pplVar29);
            lysp_type_dup(ctx->ctx,ctx->pmod,*(lysp_type **)(pcVar40 + 0x18),(lysp_type *)pplVar29);
            goto LAB_0014e525;
          }
          plVar37 = ctx->ctx;
          pcVar26 = lys_nodetype2str(uVar36);
LAB_0014f3a8:
          pcVar38 = "deviation";
          LVar30 = LYVE_REFERENCE;
          pcVar40 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
          pcVar45 = "replace";
LAB_0014f3b3:
          ly_vlog(plVar37,(char *)0x0,LVar30,pcVar40,pcVar38,pcVar26,pcVar45);
          goto LAB_0014f3bc;
        }
LAB_0014e525:
        pcVar45 = *(char **)(pcVar40 + 0x20);
        if ((lysp_ext_instance *)pcVar45 != (lysp_ext_instance *)0x0) {
          uVar36 = plVar23->nodetype;
          if ((uVar36 != 4) && (uVar36 != 8)) {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(uVar36);
            goto LAB_0014f3a8;
          }
          plVar37 = ctx->ctx;
          if (*pplVar1 == (lysp_ext_instance *)0x0) {
            pcVar26 = "units";
LAB_0014f078:
            pcVar38 = "replacing";
            LVar30 = LYVE_REFERENCE;
            pcVar40 = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
            goto LAB_0014f3b3;
          }
          lydict_remove(plVar37,(char *)*pplVar1);
          LVar14 = lydict_dup(ctx->ctx,*(char **)(pcVar40 + 0x20),(char **)pplVar1);
          if (LVar14 == LY_SUCCESS) goto LAB_0014e57c;
          goto LAB_0014eeb6;
        }
LAB_0014e57c:
        pcVar45 = *(char **)(pcVar40 + 0x28);
        if ((lysp_ext_instance *)pcVar45 != (lysp_ext_instance *)0x0) {
          uVar36 = plVar23->nodetype;
          plVar22 = (lysp_node *)pplVar29;
          if ((uVar36 != 2) && (plVar22 = plVar33, uVar36 != 4)) {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(uVar36);
            goto LAB_0014f3a8;
          }
          plVar37 = ctx->ctx;
          if (plVar22->parent == (lysp_node *)0x0) {
            pcVar26 = "default";
            goto LAB_0014f078;
          }
          lydict_remove(plVar37,(char *)plVar22->parent);
          LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(pcVar40 + 0x28),(lysp_qname *)plVar22);
          if (LVar14 != LY_SUCCESS) goto LAB_0014eeb6;
        }
        uVar13 = *(ushort *)(pcVar40 + 0x40);
        if ((uVar13 & 3) != 0) {
          uVar3 = plVar23->nodetype;
          if (((0x20 < (ulong)uVar3) || ((0x100010116U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
             (uVar3 != 0x60)) {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(uVar3);
            goto LAB_0014f3a8;
          }
          plVar23->flags = uVar13 & 3 | plVar23->flags & 0xfffc;
        }
        if ((uVar13 & 0x60) != 0) {
          uVar3 = plVar23->nodetype;
          if (((0x20 < (ulong)uVar3) || ((0x100000014U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
             (uVar3 != 0x60)) {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(uVar3);
            goto LAB_0014f3a8;
          }
          plVar23->flags = uVar13 & 0x60 | plVar23->flags & 0xff9f;
        }
        if ((uVar13 >> 9 & 1) != 0) {
          uVar36 = plVar23->nodetype;
          lVar28 = 200;
          if (uVar36 != 8) {
            if (uVar36 != 0x10) {
              plVar37 = ctx->ctx;
              pcVar26 = lys_nodetype2str(uVar36);
              goto LAB_0014f3a8;
            }
            lVar28 = 0x88;
          }
          *(undefined4 *)((long)&plVar23->parent + lVar28) = *(undefined4 *)(pcVar40 + 0x44);
        }
        if ((uVar13 >> 10 & 1) != 0) {
          uVar36 = plVar23->nodetype;
          lVar28 = 0xcc;
          if (uVar36 != 8) {
            if (uVar36 != 0x10) {
              plVar37 = ctx->ctx;
              pcVar26 = lys_nodetype2str(uVar36);
              goto LAB_0014f3a8;
            }
            lVar28 = 0x8c;
          }
          *(undefined4 *)((long)&plVar23->parent + lVar28) = *(undefined4 *)(pcVar40 + 0x48);
        }
      }
      else {
        if (cVar2 != '\x03') {
          if (cVar2 == '\x02') {
            if (*(char **)(pcVar40 + 0x18) == (char *)0x0) {
LAB_0014e2b8:
              if (*(long *)(pcVar40 + 0x20) == 0) {
LAB_0014e5ae:
                lVar28 = *(long *)(pcVar40 + 0x28);
                if (lVar28 != 0) {
                  if (plVar23->nodetype != 0x10) {
                    plVar37 = ctx->ctx;
                    pcVar40 = lys_nodetype2str(plVar23->nodetype);
                    pcVar26 = "unique";
                    goto LAB_0014f0b7;
                  }
                  lVar27 = 0;
                  uVar44 = 0;
                  while( true ) {
                    if (lVar28 == 0) {
                      uVar18 = 0;
                    }
                    else {
                      uVar18 = *(ulong *)(lVar28 + -8);
                    }
                    if (uVar18 <= uVar44) break;
                    plVar22 = plVar23[2].parent;
                    if (plVar22 == (lysp_node *)0x0) {
                      plVar19 = (long *)malloc(0x20);
                      if (plVar19 == (long *)0x0) goto LAB_0014ee8d;
                      *plVar19 = 1;
                      lVar28 = 1;
                    }
                    else {
                      plVar43 = plVar22[-1].exts;
                      plVar22[-1].exts = (lysp_ext_instance *)((long)&plVar43->name + 1);
                      plVar19 = (long *)realloc(&plVar22[-1].exts,(long)plVar43 * 0x18 + 0x20);
                      if (plVar19 == (long *)0x0) {
                        plVar23 = plVar23[2].parent;
                        goto LAB_0014ee89;
                      }
                      lVar28 = *plVar19;
                    }
                    plVar23[2].parent = (lysp_node *)(plVar19 + 1);
                    plVar19 = plVar19 + lVar28 * 3;
                    ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                    plVar19[-1] = 0;
                    *plVar19 = 0;
                    LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)
                                                     (*(long *)(pcVar40 + 0x28) + lVar27),
                                            (lysp_qname *)(plVar19 + -2));
                    if (LVar14 != LY_SUCCESS) goto LAB_0014eeb6;
                    uVar44 = uVar44 + 1;
                    lVar28 = *(long *)(pcVar40 + 0x28);
                    lVar27 = lVar27 + 0x18;
                  }
                }
                plVar35 = *(lysp_qname **)(pcVar40 + 0x30);
                if (plVar35 == (lysp_qname *)0x0) {
LAB_0014e8f9:
                  uVar13 = *(ushort *)(pcVar40 + 0x38);
                  if ((uVar13 & 3) != 0) {
                    uVar3 = plVar23->nodetype;
                    if (((0x20 < (ulong)uVar3) || ((0x100010116U >> ((ulong)uVar3 & 0x3f) & 1) == 0)
                        ) && (uVar3 != 0x60)) {
                      plVar37 = ctx->ctx;
                      pcVar40 = lys_nodetype2str(uVar3);
                      pcVar26 = "config";
                      goto LAB_0014f0b7;
                    }
                    uVar3 = plVar23->flags;
                    if ((uVar3 & 3) != 0) {
                      pcVar40 = "true";
                      if ((uVar3 & 1) == 0) {
                        pcVar40 = "false";
                      }
                      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                              "Invalid deviation adding \"config\" property which already exists (with value \"config %s\")."
                              ,pcVar40);
                      goto LAB_0014ee69;
                    }
                    plVar23->flags = uVar3 | uVar13 & 3;
                  }
                  if ((uVar13 & 0x60) != 0) {
                    uVar3 = plVar23->nodetype;
                    if (((0x20 < (ulong)uVar3) || ((0x100000014U >> ((ulong)uVar3 & 0x3f) & 1) == 0)
                        ) && (uVar3 != 0x60)) {
                      plVar37 = ctx->ctx;
                      pcVar26 = lys_nodetype2str(uVar3);
                      goto LAB_0014f100;
                    }
                    uVar3 = plVar23->flags;
                    if ((uVar3 & 0x60) != 0) {
                      pcVar40 = "true";
                      if ((uVar3 & 0x20) == 0) {
                        pcVar40 = "false";
                      }
                      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                              "Invalid deviation adding \"mandatory\" property which already exists (with value \"mandatory %s\")."
                              ,pcVar40);
                      goto LAB_0014f3bc;
                    }
                    plVar23->flags = uVar3 | uVar13 & 0x60;
                  }
                  if ((uVar13 >> 9 & 1) != 0) {
                    uVar36 = plVar23->nodetype;
                    lVar28 = 200;
                    if (uVar36 != 8) {
                      if (uVar36 != 0x10) {
                        plVar37 = ctx->ctx;
                        pcVar26 = lys_nodetype2str(uVar36);
                        goto LAB_0014f100;
                      }
                      lVar28 = 0x88;
                    }
                    if ((plVar23->flags & 0x200) == 0) {
                      *(undefined4 *)((long)&plVar23->parent + lVar28) =
                           *(undefined4 *)(pcVar40 + 0x3c);
                      goto LAB_0014e9c2;
                    }
                    plVar37 = ctx->ctx;
                    uVar4 = *(uint *)((long)&plVar23->parent + lVar28);
                    pcVar40 = 
                    "Invalid deviation adding \"min-elements\" property which already exists (with value \"%u\")."
                    ;
LAB_0014f36f:
                    ly_vlog(plVar37,(char *)0x0,LYVE_REFERENCE,pcVar40,(ulong)uVar4);
                    goto LAB_0014f3bc;
                  }
LAB_0014e9c2:
                  if ((uVar13 >> 10 & 1) != 0) {
                    uVar36 = plVar23->nodetype;
                    lVar28 = 0xcc;
                    if (uVar36 != 8) {
                      if (uVar36 != 0x10) {
                        plVar37 = ctx->ctx;
                        pcVar26 = lys_nodetype2str(uVar36);
                        goto LAB_0014f100;
                      }
                      lVar28 = 0x8c;
                    }
                    if ((plVar23->flags & 0x400) != 0) {
                      uVar4 = *(uint *)((long)&plVar23->parent + lVar28);
                      plVar37 = ctx->ctx;
                      if (uVar4 == 0) {
                        ly_vlog(plVar37,(char *)0x0,LYVE_REFERENCE,
                                "Invalid deviation adding \"max-elements\" property which already exists (with value \"unbounded\")."
                               );
                        goto LAB_0014f3bc;
                      }
                      pcVar40 = 
                      "Invalid deviation adding \"max-elements\" property which already exists (with value \"%u\")."
                      ;
                      goto LAB_0014f36f;
                    }
                    *(undefined4 *)((long)&plVar23->parent + lVar28) =
                         *(undefined4 *)(pcVar40 + 0x40);
                  }
                  goto LAB_0014ecba;
                }
                uVar36 = plVar23->nodetype;
                if (uVar36 == 2) {
                  plVar22 = (lysp_node *)pplVar29;
                  if (1 < *(ulong *)&plVar35[-1].flags) {
                    plVar37 = ctx->ctx;
                    pcVar26 = lys_nodetype2str(2);
                    if (*(long *)(pcVar40 + 0x30) == 0) {
                      pcVar45 = (char *)0x0;
                    }
                    else {
                      pcVar45 = *(char **)(*(long *)(pcVar40 + 0x30) + -8);
                    }
LAB_0014f5b6:
                    LVar30 = LYVE_SEMANTICS;
                    pcVar40 = "Invalid %s of %s with too many (%lu) %s properties.";
                    pcVar38 = "deviation";
                    goto LAB_0014f3b3;
                  }
                }
                else {
                  if (uVar36 != 4) {
                    if (uVar36 == 8) {
                      lVar28 = 0;
                      uVar44 = 0;
LAB_0014e6c8:
                      if (plVar35 == (lysp_qname *)0x0) {
                        uVar18 = 0;
                      }
                      else {
                        uVar18 = *(ulong *)&plVar35[-1].flags;
                      }
                      if (uVar44 < uVar18) {
                        plVar22 = plVar33->parent;
                        if (plVar22 == (lysp_node *)0x0) {
                          plVar19 = (long *)malloc(0x20);
                          if (plVar19 != (long *)0x0) {
                            *plVar19 = 1;
                            lVar27 = 1;
LAB_0014e734:
                            plVar33->parent = (lysp_node *)(plVar19 + 1);
                            plVar19 = plVar19 + lVar27 * 3;
                            ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                            plVar19[-1] = 0;
                            *plVar19 = 0;
                            LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)
                                                             (*(long *)(pcVar40 + 0x30) + lVar28),
                                                    (lysp_qname *)(plVar19 + -2));
                            if (LVar14 == LY_SUCCESS) goto code_r0x0014e772;
                            goto LAB_0014eeb6;
                          }
                        }
                        else {
                          plVar43 = plVar22[-1].exts;
                          plVar22[-1].exts = (lysp_ext_instance *)((long)&plVar43->name + 1);
                          plVar19 = (long *)realloc(&plVar22[-1].exts,(long)plVar43 * 0x18 + 0x20);
                          if (plVar19 != (long *)0x0) {
                            lVar27 = *plVar19;
                            goto LAB_0014e734;
                          }
                          plVar23 = plVar33->parent;
LAB_0014ee89:
                          plVar23[-1].exts =
                               (lysp_ext_instance *)((long)&plVar23[-1].exts[-1].exts + 7);
                        }
LAB_0014ee8d:
                        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                               "lys_apply_deviate_add");
                        LVar14 = LY_EMEM;
                        goto LAB_0014eeb6;
                      }
                      goto LAB_0014e8f9;
                    }
                    plVar37 = ctx->ctx;
                    pcVar40 = lys_nodetype2str(uVar36);
                    pcVar26 = "default";
                    goto LAB_0014f0b7;
                  }
                  plVar22 = plVar33;
                  if (1 < *(ulong *)&plVar35[-1].flags) {
                    plVar37 = ctx->ctx;
                    pcVar26 = lys_nodetype2str(4);
                    if (*(long *)(pcVar40 + 0x30) == 0) {
                      pcVar45 = (char *)0x0;
                    }
                    else {
                      pcVar45 = *(char **)(*(long *)(pcVar40 + 0x30) + -8);
                    }
                    goto LAB_0014f5b6;
                  }
                }
                plVar39 = plVar22->parent;
                plVar37 = ctx->ctx;
                if (plVar39 != (lysp_node *)0x0) {
                  pcVar40 = 
                  "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                  ;
LAB_0014ef42:
                  pcVar26 = "default";
LAB_0014ee62:
                  ly_vlog(plVar37,(char *)0x0,LYVE_REFERENCE,pcVar40,pcVar26,plVar39);
                  goto LAB_0014ee69;
                }
                LVar14 = lysp_qname_dup(plVar37,plVar35,(lysp_qname *)plVar22);
                if (LVar14 == LY_SUCCESS) goto LAB_0014e8f9;
              }
              else {
                pplVar20 = lysp_node_musts_p(plVar23);
                if (pplVar20 != (lysp_restr **)0x0) {
                  uVar44 = 0xffffffffffffffff;
                  lVar28 = 0;
                  while( true ) {
                    if (*(long *)(pcVar40 + 0x20) == 0) {
                      uVar18 = 0;
                    }
                    else {
                      uVar18 = *(ulong *)(*(long *)(pcVar40 + 0x20) + -8);
                    }
                    uVar44 = uVar44 + 1;
                    if (uVar18 <= uVar44) break;
                    plVar9 = *pplVar20;
                    if (plVar9 == (lysp_restr *)0x0) {
                      plVar19 = (long *)malloc(0x48);
                      if (plVar19 == (long *)0x0) goto LAB_0014ee8d;
                      *plVar19 = 1;
                    }
                    else {
                      plVar43 = (lysp_ext_instance *)((long)&(plVar9[-1].exts)->name + 1);
                      plVar9[-1].exts = plVar43;
                      plVar19 = (long *)realloc(&plVar9[-1].exts,(long)plVar43 * 0x40 | 8);
                      if (plVar19 == (long *)0x0) {
                        plVar23 = (lysp_node *)*pplVar20;
                        goto LAB_0014ee89;
                      }
                    }
                    *pplVar20 = (lysp_restr *)(plVar19 + 1);
                    plVar19 = plVar19 + *plVar19 * 8;
                    plVar19[-1] = 0;
                    *plVar19 = 0;
                    plVar19[-3] = 0;
                    plVar19[-2] = 0;
                    plVar19[-5] = 0;
                    plVar19[-4] = 0;
                    (((lysp_restr *)(plVar19 + -7))->arg).str = (char *)0x0;
                    plVar19[-6] = 0;
                    LVar14 = lysp_restr_dup(ctx->ctx,ctx->pmod,
                                            (lysp_restr *)(*(long *)(pcVar40 + 0x20) + lVar28),
                                            (lysp_restr *)(plVar19 + -7));
                    lVar28 = lVar28 + 0x40;
                    if (LVar14 != LY_SUCCESS) goto LAB_0014eeb6;
                  }
                  goto LAB_0014e5ae;
                }
                plVar37 = ctx->ctx;
                pcVar40 = lys_nodetype2str(plVar23->nodetype);
                pcVar26 = "must";
LAB_0014f0b7:
                ly_vlog(plVar37,(char *)0x0,LYVE_REFERENCE,
                        "Invalid %s of %s node - it is not possible to %s \"%s\" property.",
                        "deviation",pcVar40,"add",pcVar26);
LAB_0014ee69:
                LVar14 = LY_EVALID;
              }
            }
            else {
              uVar36 = plVar23->nodetype;
              if ((uVar36 != 4) && (uVar36 != 8)) {
                plVar37 = ctx->ctx;
                pcVar26 = lys_nodetype2str(uVar36);
LAB_0014f100:
                pcVar38 = "deviation";
                LVar30 = LYVE_REFERENCE;
                pcVar40 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                pcVar45 = "add";
                goto LAB_0014f3b3;
              }
              if (*pplVar1 == (lysp_ext_instance *)0x0) {
                LVar14 = lydict_dup(ctx->ctx,*(char **)(pcVar40 + 0x18),(char **)pplVar1);
                if (LVar14 == LY_SUCCESS) goto LAB_0014e2b8;
              }
              else {
                ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                        ,"units");
LAB_0014f3bc:
                LVar14 = LY_EVALID;
              }
            }
          }
          else {
            ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                   ,0x62f);
            LVar14 = LY_EINT;
          }
          goto LAB_0014eeb6;
        }
        pcVar26 = *(char **)(pcVar40 + 0x18);
        if ((lysp_ext_instance *)pcVar26 != (lysp_ext_instance *)0x0) {
          uVar36 = plVar23->nodetype;
          if ((uVar36 == 4) || (uVar36 == 8)) {
            pcVar45 = (char *)*pplVar1;
            if ((lysp_ext_instance *)pcVar45 == (lysp_ext_instance *)0x0) {
              plVar37 = ctx->ctx;
              pcVar40 = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
              pcVar38 = "deleting";
              __s2 = "units";
              pcVar45 = pcVar26;
LAB_0014ef93:
              LVar30 = LYVE_REFERENCE;
              pcVar26 = __s2;
            }
            else {
              iVar16 = strcmp(pcVar45,pcVar26);
              plVar37 = ctx->ctx;
              if (iVar16 == 0) {
                lydict_remove(plVar37,pcVar45);
                *pplVar1 = (lysp_ext_instance *)0x0;
                goto LAB_0014e409;
              }
              LVar30 = LYVE_REFERENCE;
              pcVar40 = 
              "Invalid deviation deleting \"%s\" property \"%s\" which does not match the target\'s property value \"%s\"."
              ;
              pcVar38 = "units";
            }
          }
          else {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(uVar36);
LAB_0014f212:
            pcVar38 = "deviation";
            LVar30 = LYVE_REFERENCE;
            pcVar40 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
            pcVar45 = "delete";
          }
          goto LAB_0014f3b3;
        }
LAB_0014e409:
        if (*(long *)(pcVar40 + 0x20) != 0) {
          pplVar20 = lysp_node_musts_p(plVar23);
          if (pplVar20 == (lysp_restr **)0x0) {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(plVar23->nodetype);
            goto LAB_0014f212;
          }
          uVar44 = 0;
          while( true ) {
            lVar28 = *(long *)(pcVar40 + 0x20);
            if (lVar28 == 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = *(ulong *)(lVar28 + -8);
            }
            plVar9 = *pplVar20;
            if (uVar18 <= uVar44) break;
            puVar34 = (undefined8 *)(lVar28 + uVar44 * 0x40);
            lVar28 = 0;
            plVar43 = (lysp_ext_instance *)0x0;
            while( true ) {
              if (plVar9 == (lysp_restr *)0x0) {
                plVar21 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar21 = plVar9[-1].exts;
              }
              if (plVar21 <= plVar43) {
                plVar37 = ctx->ctx;
                plVar39 = (lysp_node *)*puVar34;
                pcVar40 = 
                "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                ;
                pcVar26 = "must";
                goto LAB_0014ee62;
              }
              iVar16 = strcmp((char *)*puVar34,*(char **)((long)&(plVar9->arg).str + lVar28));
              if (iVar16 == 0) break;
              plVar43 = (lysp_ext_instance *)((long)&plVar43->name + 1);
              lVar28 = lVar28 + 0x40;
            }
            plVar9[-1].exts = (lysp_ext_instance *)((long)&plVar9[-1].exts[-1].exts + 7);
            lysp_restr_free(&ctx->free_ctx,(lysp_restr *)((long)&(plVar9->arg).str + lVar28));
            plVar9 = *pplVar20;
            if ((plVar9 != (lysp_restr *)0x0) &&
               (lVar27 = (long)plVar9[-1].exts - (long)plVar43,
               plVar43 <= plVar9[-1].exts && lVar27 != 0)) {
              memmove((void *)((long)&(plVar9->arg).str + lVar28),
                      (void *)((long)&plVar9[1].arg.str + lVar28),lVar27 * 0x40);
            }
            uVar44 = uVar44 + 1;
          }
          if (plVar9 != (lysp_restr *)0x0) {
            if (plVar9[-1].exts != (lysp_ext_instance *)0x0) goto LAB_0014ea2e;
            free(&plVar9[-1].exts);
          }
          *pplVar20 = (lysp_restr *)0x0;
        }
LAB_0014ea2e:
        lVar28 = *(long *)(pcVar40 + 0x28);
        if (lVar28 != 0) {
          if (plVar23->nodetype != 0x10) {
            plVar37 = ctx->ctx;
            pcVar26 = lys_nodetype2str(plVar23->nodetype);
            goto LAB_0014f212;
          }
          uVar44 = 0;
          while( true ) {
            if (lVar28 == 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = *(ulong *)(lVar28 + -8);
            }
            plVar22 = plVar23[2].parent;
            if (uVar18 <= uVar44) break;
            puVar34 = (undefined8 *)(lVar28 + uVar44 * 0x18);
            lVar28 = 0;
            plVar43 = (lysp_ext_instance *)0x0;
            while( true ) {
              if (plVar22 == (lysp_node *)0x0) {
                plVar21 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar21 = plVar22[-1].exts;
              }
              if (plVar21 <= plVar43) {
                plVar37 = ctx->ctx;
                plVar39 = (lysp_node *)*puVar34;
                pcVar40 = 
                "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                ;
                pcVar26 = "unique";
                goto LAB_0014ee62;
              }
              iVar16 = strcmp((char *)*puVar34,*(char **)((long)&plVar22->parent + lVar28));
              if (iVar16 == 0) break;
              plVar43 = (lysp_ext_instance *)((long)&plVar43->name + 1);
              lVar28 = lVar28 + 0x18;
            }
            plVar22[-1].exts = (lysp_ext_instance *)((long)&plVar22[-1].exts[-1].exts + 7);
            lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar22->parent + lVar28));
            plVar22 = plVar23[2].parent;
            if ((plVar22 != (lysp_node *)0x0) &&
               (lVar27 = (long)plVar22[-1].exts - (long)plVar43,
               plVar43 <= plVar22[-1].exts && lVar27 != 0)) {
              memmove((void *)((long)&plVar22->parent + lVar28),
                      (void *)((long)&plVar22->name + lVar28),lVar27 * 0x18);
            }
            uVar44 = uVar44 + 1;
            lVar28 = *(long *)(pcVar40 + 0x28);
          }
          if (plVar22 != (lysp_node *)0x0) {
            if (plVar22[-1].exts != (lysp_ext_instance *)0x0) goto LAB_0014eb40;
            free(&plVar22[-1].exts);
          }
          plVar23[2].parent = (lysp_node *)0x0;
        }
LAB_0014eb40:
        puVar34 = *(undefined8 **)(pcVar40 + 0x30);
        if (puVar34 != (undefined8 *)0x0) {
          uVar36 = plVar23->nodetype;
          if (uVar36 != 2) {
            if (uVar36 == 4) {
              if (1 < (ulong)puVar34[-1]) {
                plVar37 = ctx->ctx;
                uVar36 = 4;
                goto LAB_0014f596;
              }
              pcVar45 = (char *)plVar33->parent;
              if ((lysp_ext_instance *)pcVar45 == (lysp_ext_instance *)0x0) goto LAB_0014f481;
              __s2 = (char *)*puVar34;
              iVar16 = strcmp(pcVar45,__s2);
              plVar37 = ctx->ctx;
              if (iVar16 != 0) goto LAB_0014f4e4;
              lydict_remove(plVar37,pcVar45);
              plVar22 = plVar33;
LAB_0014ecae:
              plVar22->parent = (lysp_node *)0x0;
            }
            else {
              if (uVar36 != 8) {
                plVar37 = ctx->ctx;
                pcVar26 = lys_nodetype2str(uVar36);
                goto LAB_0014f212;
              }
              uVar44 = 0;
              while( true ) {
                if (puVar34 == (undefined8 *)0x0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = puVar34[-1];
                }
                plVar22 = plVar33->parent;
                if (uVar18 <= uVar44) break;
                lVar28 = 0;
                plVar43 = (lysp_ext_instance *)0x0;
                while( true ) {
                  if (plVar22 == (lysp_node *)0x0) {
                    plVar21 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar21 = plVar22[-1].exts;
                  }
                  if (plVar21 <= plVar43) {
                    plVar37 = ctx->ctx;
                    plVar39 = (lysp_node *)puVar34[uVar44 * 3];
                    pcVar40 = 
                    "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                    ;
                    goto LAB_0014ef42;
                  }
                  iVar16 = strcmp((char *)puVar34[uVar44 * 3],
                                  *(char **)((long)&plVar22->parent + lVar28));
                  if (iVar16 == 0) break;
                  plVar43 = (lysp_ext_instance *)((long)&plVar43->name + 1);
                  lVar28 = lVar28 + 0x18;
                }
                plVar22[-1].exts = (lysp_ext_instance *)((long)&plVar22[-1].exts[-1].exts + 7);
                lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar22->parent + lVar28));
                plVar22 = plVar33->parent;
                if ((plVar22 != (lysp_node *)0x0) &&
                   (lVar27 = (long)plVar22[-1].exts - (long)plVar43,
                   plVar43 <= plVar22[-1].exts && lVar27 != 0)) {
                  memmove((void *)((long)&plVar22->parent + lVar28),
                          (void *)((long)&plVar22->name + lVar28),lVar27 * 0x18);
                }
                uVar44 = uVar44 + 1;
                puVar34 = *(undefined8 **)(pcVar40 + 0x30);
              }
              if (plVar22 != (lysp_node *)0x0) {
                if (plVar22[-1].exts != (lysp_ext_instance *)0x0) goto LAB_0014ecba;
                free(&plVar22[-1].exts);
              }
              plVar33->parent = (lysp_node *)0x0;
            }
            goto LAB_0014ecba;
          }
          if ((ulong)puVar34[-1] < 2) {
            pcVar45 = (char *)*pplVar29;
            if ((lysp_ext_instance *)pcVar45 != (lysp_ext_instance *)0x0) {
              __s2 = (char *)*puVar34;
              iVar16 = strcmp(pcVar45,__s2);
              plVar37 = ctx->ctx;
              if (iVar16 != 0) {
LAB_0014f4e4:
                pcVar40 = 
                "Invalid deviation deleting \"%s\" property \"%s\" which does not match the target\'s property value \"%s\"."
                ;
                pcVar38 = "default";
                goto LAB_0014ef93;
              }
              lydict_remove(plVar37,pcVar45);
              plVar22 = (lysp_node *)pplVar29;
              goto LAB_0014ecae;
            }
LAB_0014f481:
            plVar37 = ctx->ctx;
            LVar30 = LYVE_REFERENCE;
            pcVar40 = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
            pcVar38 = "deleting";
            pcVar26 = "default";
            pcVar45 = (char *)*puVar34;
            goto LAB_0014f3b3;
          }
          plVar37 = ctx->ctx;
          uVar36 = 2;
LAB_0014f596:
          pcVar26 = lys_nodetype2str(uVar36);
          if (*(long *)(pcVar40 + 0x30) == 0) {
            uVar41 = 0;
          }
          else {
            uVar41 = *(undefined8 *)(*(long *)(pcVar40 + 0x30) + -8);
          }
          ly_vlog(plVar37,(char *)0x0,LYVE_SEMANTICS,
                  "Invalid %s of %s with too many (%lu) %s properties.","deviation",pcVar26,uVar41,
                  "default");
          LVar14 = LY_EVALID;
          goto LAB_0014eeb6;
        }
      }
LAB_0014ecba:
      pcVar40 = *(char **)(pcVar40 + 8);
    } while (pcVar40 != (char *)0x0);
  }
  lVar28 = puVar7[4];
  LVar14 = LY_SUCCESS;
  if (lVar28 != 0) {
    plVar43 = plVar23->exts;
    if (plVar43 == (lysp_ext_instance *)0x0) {
      plVar19 = (long *)calloc(1,*(long *)(lVar28 + -8) * 0x70 | 8);
      if (plVar19 == (long *)0x0) goto LAB_0014f6ce;
      lVar28 = 0;
      plVar21 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar21 = plVar43[-1].exts;
      plVar19 = (long *)realloc(&plVar43[-1].exts,
                                ((long)&plVar21->name + *(long *)(lVar28 + -8)) * 0x70 | 8);
      if (plVar19 == (long *)0x0) {
LAB_0014f6ce:
        plVar37 = ctx->ctx;
        pcVar17 = "lys_apply_deviation";
LAB_0014f6e0:
        LVar14 = LY_EMEM;
        ly_log(plVar37,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar17);
LAB_0014f669:
        lysp_dev_node_free(ctx,*dev_pnode);
        *dev_pnode = (lysp_node *)0x0;
        *not_supported = '\0';
        return LVar14;
      }
      lVar28 = *plVar19;
    }
    plVar23->exts = (lysp_ext_instance *)(plVar19 + 1);
    if (puVar7[4] == 0) {
      sVar32 = 0;
    }
    else {
      sVar32 = *(long *)(puVar7[4] + -8) * 0x70;
    }
    memset(plVar19 + lVar28 * 0xe + 1,0,sVar32);
    uVar44 = 0xffffffffffffffff;
    lVar28 = 0;
    while( true ) {
      if (puVar7[4] == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = *(ulong *)(puVar7[4] + -8);
      }
      uVar44 = uVar44 + 1;
      LVar14 = LY_SUCCESS;
      if (uVar18 <= uVar44) break;
      pplVar1 = &plVar23->exts[-1].exts;
      *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
      plVar37 = ctx->ctx;
      lVar15 = lyplg_ext_nodetype2stmt(plVar23->nodetype);
      LVar14 = lysp_ext_dup(plVar37,plVar8,plVar23,lVar15,(lysp_ext_instance *)(puVar7[4] + lVar28),
                            (lysp_ext_instance *)((long)&plVar23->exts[(long)plVar21].name + lVar28)
                           );
      lVar28 = lVar28 + 0x70;
      if (LVar14 != LY_SUCCESS) goto LAB_0014f669;
    }
  }
LAB_0014eeb6:
  ctx->cur_mod = plVar10;
  ctx->pmod = plVar11;
  strcpy(pcVar17,local_1028);
  sVar32 = strlen(pcVar17);
  ctx->path_len = (uint32_t)sVar32;
  pvVar31 = (void *)((long)pvVar31 + 1);
  if (LVar14 != LY_SUCCESS) goto LAB_0014f669;
  goto LAB_0014e193;
code_r0x0014e772:
  uVar44 = uVar44 + 1;
  plVar35 = *(lysp_qname **)(pcVar40 + 0x30);
  lVar28 = lVar28 + 0x18;
  goto LAB_0014e6c8;
}

Assistant:

LY_ERR
lys_compile_node_deviations_refines(struct lysc_ctx *ctx, const struct lysp_node *pnode, const struct lysc_node *parent,
        struct lysp_node **dev_pnode, ly_bool *not_supported)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_refine *rfn;
    struct lysc_deviation *dev;

    *dev_pnode = NULL;
    *not_supported = 0;

    for (i = 0; i < ctx->uses_rfns.count; ) {
        rfn = ctx->uses_rfns.objs[i];

        if (!lysp_schema_nodeid_match(rfn->nodeid, rfn->nodeid_pmod, NULL, rfn->nodeid_ctx_node, parent, pnode,
                ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            ++i;
            continue;
        }

        if (!*dev_pnode) {
            /* first refine on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the refines by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(rfn->rfns, u) {
            LY_CHECK_GOTO(ret = lys_apply_refine(ctx, rfn->rfns[u], rfn->nodeid_pmod, *dev_pnode), cleanup);
        }

        /* refine was applied, remove it */
        lysc_refine_free(ctx->ctx, rfn);
        ly_set_rm_index(&ctx->uses_rfns, i, NULL);

        /* refines use relative paths so more may apply to a single node */
    }

    for (i = 0; i < ctx->devs.count; ++i) {
        dev = ctx->devs.objs[i];

        if (!lysp_schema_nodeid_match(dev->nodeid, dev->dev_pmods[0], NULL, NULL, parent, pnode, ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            continue;
        }

        if (dev->not_supported) {
            /* it is not supported, no more deviations */
            *not_supported = 1;
            goto dev_applied;
        }

        if (!*dev_pnode) {
            /* first deviation on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the deviates by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(dev->devs, u) {
            LY_CHECK_GOTO(ret = lys_apply_deviation(ctx, dev->devs[u], dev->dev_pmods[u], *dev_pnode), cleanup);
        }

dev_applied:
        /* deviation was applied, remove it */
        lysc_deviation_free(ctx->ctx, dev);
        ly_set_rm_index(&ctx->devs, i, NULL);

        /* all the deviations for one target node are in one structure, we are done */
        break;
    }

cleanup:
    if (ret) {
        lysp_dev_node_free(ctx, *dev_pnode);
        *dev_pnode = NULL;
        *not_supported = 0;
    }
    return ret;
}